

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder output_00;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  word *__dest;
  uchar *__src;
  ArrayPtr<const_capnp::word> AVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<unsigned_char> AVar6;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  ReaderOptions options_03;
  Reader local_cd0;
  Reader local_c98;
  RawBrandedSchema *local_c68;
  Schema SStack_c60;
  SegmentBuilder *local_c58;
  CapTableBuilder *pCStack_c50;
  void *local_c48;
  WirePointer *pWStack_c40;
  ArrayPtr<const_char> local_c38;
  Schema local_c28;
  undefined1 auStack_c20 [8];
  Builder root_1;
  undefined1 local_be8 [8];
  JsonCodec codec_1;
  MallocMessageBuilder message_5;
  String text_1;
  Reader local_a98;
  Schema local_a68;
  Schema SStack_a60;
  SegmentBuilder *local_a58;
  CapTableBuilder *pCStack_a50;
  void *local_a48;
  WirePointer *pWStack_a40;
  ArrayPtr<const_char> local_a30;
  Schema local_a20;
  undefined1 auStack_a18 [8];
  Builder root;
  undefined1 local_9e0 [7];
  TextCodec codec;
  MallocMessageBuilder message_4;
  String text;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_898;
  undefined1 local_888 [8];
  SegmentArrayMessageReader message_3;
  ArrayPtr<const_capnp::word> segments_1 [1];
  Fault f_1;
  ArrayPtr<capnp::word> local_788;
  ArrayPtr<unsigned_char> local_778;
  size_t local_768;
  DebugExpression<unsigned_long> local_760;
  undefined1 local_758 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_1;
  word dummy;
  undefined1 local_718 [8];
  PackedInputStream unpacker;
  undefined1 local_6f8 [8];
  ArrayInputStream input_1;
  undefined1 local_6d0 [8];
  Array<capnp::word> words_1;
  Vector<unsigned_char> allBytes_1;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  Fault local_668;
  Fault f;
  DebugExpression<bool> _kjCondition;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_648;
  undefined1 local_638 [8];
  SegmentArrayMessageReader message_2;
  ArrayPtr<const_capnp::word> segments [1];
  undefined1 local_540 [8];
  Array<capnp::word> words;
  Vector<unsigned_char> allBytes;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  ArrayPtr<capnp::word> local_4d8;
  UnwindDetector local_4c8;
  undefined4 uStack_4c4;
  int iStack_4c0;
  undefined1 local_4b8 [8];
  PackedMessageReader message_1;
  Reader local_378;
  ArrayPtr<capnp::word> local_338;
  UnwindDetector local_328;
  undefined4 uStack_324;
  int iStack_320;
  undefined1 local_310 [8];
  InputStreamMessageReader message;
  ParseErrorCatcher parseErrorCatcher;
  ReaderOptions options;
  OutputStream *output_local;
  BufferedInputStreamWrapper *input_local;
  CompilerMain *this_local;
  
  ReaderOptions::ReaderOptions((ReaderOptions *)&parseErrorCatcher.unwindDetector);
  iVar2 = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  parseErrorCatcher._432_8_ =
       kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
  ParseErrorCatcher::ParseErrorCatcher((ParseErrorCatcher *)&message.unwindDetector,this->context);
  switch(this->convertFrom) {
  case BINARY:
    local_328.uncaughtCount = parseErrorCatcher.unwindDetector.uncaughtCount;
    uStack_324 = parseErrorCatcher._436_4_;
    iStack_320 = iVar2;
    kj::ArrayPtr<capnp::word>::ArrayPtr(&local_338,(void *)0x0);
    options_00.nestingLimit = iStack_320;
    options_00.traversalLimitInWords = _local_328;
    options_00._12_4_ = 0;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)local_310,(InputStream *)input,options_00,local_338);
    MessageReader::getRoot<capnp::AnyStruct>(&local_378,(MessageReader *)local_310);
    reader._reader.capTable = local_378._reader.capTable;
    reader._reader.segment = local_378._reader.segment;
    reader._reader.data = local_378._reader.data;
    reader._reader.pointers = local_378._reader.pointers;
    reader._reader.dataSize = local_378._reader.dataSize;
    reader._reader.pointerCount = local_378._reader.pointerCount;
    reader._reader._38_2_ = local_378._reader._38_2_;
    reader._reader.nestingLimit = local_378._reader.nestingLimit;
    reader._reader._44_4_ = local_378._reader._44_4_;
    writeConversion(this,reader,output);
    message_1.super_InputStreamMessageReader._292_4_ = 1;
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)local_310);
    break;
  case PACKED:
    local_4c8.uncaughtCount = parseErrorCatcher.unwindDetector.uncaughtCount;
    uStack_4c4 = parseErrorCatcher._436_4_;
    iStack_4c0 = iVar2;
    kj::ArrayPtr<capnp::word>::ArrayPtr(&local_4d8,(void *)0x0);
    options_01.nestingLimit = iStack_4c0;
    options_01.traversalLimitInWords = _local_4c8;
    options_01._12_4_ = 0;
    PackedMessageReader::PackedMessageReader
              ((PackedMessageReader *)local_4b8,&input->super_BufferedInputStream,options_01,
               local_4d8);
    MessageReader::getRoot<capnp::AnyStruct>
              ((Reader *)&allBytes.builder.disposer,
               (MessageReader *)&message_1.super_PackedInputStream.inner);
    reader_00._reader.capTable = (CapTableReader *)uStack_500;
    reader_00._reader.segment = (SegmentReader *)allBytes.builder.disposer;
    reader_00._reader.data = (void *)local_4f8;
    reader_00._reader.pointers = (WirePointer *)uStack_4f0;
    reader_00._reader._32_8_ = local_4e8;
    reader_00._reader._40_8_ = uStack_4e0;
    writeConversion(this,reader_00,output);
    message_1.super_InputStreamMessageReader._292_4_ = 1;
    PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_4b8);
    break;
  case FLAT:
  case CANONICAL:
    readAll((Vector<unsigned_char> *)&words.disposer,this,input);
    sVar3 = kj::Vector<unsigned_char>::size((Vector<unsigned_char> *)&words.disposer);
    kj::heapArray<capnp::word>((Array<capnp::word> *)local_540,sVar3 >> 3);
    __dest = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_540);
    __src = kj::Vector<unsigned_char>::begin((Vector<unsigned_char> *)&words.disposer);
    sVar3 = kj::Array<capnp::word>::size((Array<capnp::word> *)local_540);
    memcpy(__dest,__src,sVar3 << 3);
    AVar4 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_540);
    message_2.segments.size_ = (size_t)AVar4.ptr;
    kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>::ArrayPtr<1ul>
              ((ArrayPtr<kj::ArrayPtr<capnp::word_const>const> *)&local_648,
               (ArrayPtr<const_capnp::word> (*) [1])&message_2.segments.size_);
    options_02.nestingLimit = iVar2;
    options_02.traversalLimitInWords = parseErrorCatcher._432_8_;
    options_02._12_4_ = 0;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_638,local_648,options_02);
    if (this->convertFrom == CANONICAL) {
      f.exception._6_1_ = MessageReader::isCanonical((MessageReader *)local_638);
      f.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6))
      ;
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f.exception + 7));
      if (!bVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                  (&local_668,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                   ,0x423,FAILED,"message.isCanonical()","_kjCondition,",
                   (DebugExpression<bool> *)((long)&f.exception + 7));
        kj::_::Debug::Fault::fatal(&local_668);
      }
    }
    MessageReader::getRoot<capnp::AnyStruct>
              ((Reader *)&allBytes_1.builder.disposer,(MessageReader *)local_638);
    reader_01._reader.capTable = (CapTableReader *)uStack_690;
    reader_01._reader.segment = (SegmentReader *)allBytes_1.builder.disposer;
    reader_01._reader.data = (void *)local_688;
    reader_01._reader.pointers = (WirePointer *)uStack_680;
    reader_01._reader._32_8_ = local_678;
    reader_01._reader._40_8_ = uStack_670;
    writeConversion(this,reader_01,output);
    message_1.super_InputStreamMessageReader._292_4_ = 1;
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_638);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_540);
    kj::Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)&words.disposer);
    break;
  case FLAT_PACKED:
    readAll((Vector<unsigned_char> *)&words_1.disposer,this,input);
    AVar5 = kj::Vector::operator_cast_to_ArrayPtr((Vector *)&words_1.disposer);
    input_1.array.size_ = (size_t)AVar5.ptr;
    AVar5.ptr = AVar5.size_;
    sVar3 = computeUnpackedSizeInWords((capnp *)input_1.array.size_,AVar5);
    kj::heapArray<capnp::word>((Array<capnp::word> *)local_6d0,sVar3);
    AVar5 = kj::Vector::operator_cast_to_ArrayPtr((Vector *)&words_1.disposer);
    unpacker.inner = (BufferedInputStream *)AVar5.ptr;
    kj::ArrayInputStream::ArrayInputStream((ArrayInputStream *)local_6f8,AVar5);
    capnp::_::PackedInputStream::PackedInputStream
              ((PackedInputStream *)local_718,(BufferedInputStream *)local_6f8);
    AVar6 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_6d0);
    kj::InputStream::read
              ((InputStream *)local_718,(int)AVar6.ptr,(void *)AVar6.size_,(size_t)AVar6.ptr);
    local_788 = kj::arrayPtr<capnp::word>((word *)&_kjCondition_1.result,1);
    local_778 = kj::ArrayPtr<capnp::word>::asBytes(&local_788);
    local_768 = capnp::_::PackedInputStream::tryRead((PackedInputStream *)local_718,local_778,8);
    local_760 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_768);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_758,&local_760,
               (int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_758);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                ((Fault *)&segments_1[0].size_,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x42f,FAILED,
                 "unpacker.tryRead(kj::arrayPtr(&dummy, 1).asBytes(), sizeof(dummy)) == 0",
                 "_kjCondition,",(DebugComparison<unsigned_long,_int> *)local_758);
      kj::_::Debug::Fault::fatal((Fault *)&segments_1[0].size_);
    }
    AVar4 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_6d0);
    segments_1[0].ptr = (word *)AVar4.size_;
    message_3.segments.size_ = (size_t)AVar4.ptr;
    kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>::ArrayPtr<1ul>
              ((ArrayPtr<kj::ArrayPtr<capnp::word_const>const> *)&local_898,
               (ArrayPtr<const_capnp::word> (*) [1])&message_3.segments.size_);
    options_03.nestingLimit = iVar2;
    options_03.traversalLimitInWords = parseErrorCatcher._432_8_;
    options_03._12_4_ = 0;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_888,local_898,options_03);
    MessageReader::getRoot<capnp::AnyStruct>
              ((Reader *)&text.content.disposer,(MessageReader *)local_888);
    reader_02._reader.capTable = (CapTableReader *)uStack_8d0;
    reader_02._reader.segment = (SegmentReader *)text.content.disposer;
    reader_02._reader.data = (void *)local_8c8;
    reader_02._reader.pointers = (WirePointer *)uStack_8c0;
    reader_02._reader._32_8_ = local_8b8;
    reader_02._reader._40_8_ = uStack_8b0;
    writeConversion(this,reader_02,output);
    message_1.super_InputStreamMessageReader._292_4_ = 1;
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_888);
    capnp::_::PackedInputStream::~PackedInputStream((PackedInputStream *)local_718);
    kj::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)local_6f8);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_6d0);
    kj::Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)&words_1.disposer);
    break;
  case TEXT:
    readOneText((String *)&message_4.moreSegments.builder.disposer,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_9e0,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&root.builder.field_0x27);
    TextCodec::setPrettyPrint((TextCodec *)&root.builder.field_0x27,(bool)(this->pretty & 1));
    local_a20.raw = (this->rootType).super_Schema.raw;
    MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
              ((Builder *)auStack_a18,(MessageBuilder *)local_9e0,(StructSchema)local_a20.raw);
    kj::StringPtr::StringPtr
              ((StringPtr *)&local_a30,(String *)&message_4.moreSegments.builder.disposer);
    local_a48 = root.builder.data;
    pWStack_a40 = root.builder.pointers;
    local_a58 = root.builder.segment;
    pCStack_a50 = root.builder.capTable;
    local_a68.raw = (RawBrandedSchema *)auStack_a18;
    SStack_a60 = root.schema.super_Schema.raw;
    output_00.builder.segment = (SegmentBuilder *)root.schema.super_Schema.raw;
    output_00.schema.super_Schema.raw = (Schema)(Schema)auStack_a18;
    output_00.builder.capTable = (CapTableBuilder *)root.builder.segment;
    output_00.builder.data = root.builder.capTable;
    output_00.builder.pointers = (WirePointer *)root.builder.data;
    output_00.builder._32_8_ = root.builder.pointers;
    TextCodec::decode((TextCodec *)&root.builder.field_0x27,(StringPtr)local_a30,output_00);
    DynamicStruct::Builder::asReader((Reader *)&text_1.content.disposer,(Builder *)auStack_a18);
    DynamicStruct::Reader::operator_cast_to_Reader(&local_a98,(Reader *)&text_1.content.disposer);
    reader_03._reader.capTable = local_a98._reader.capTable;
    reader_03._reader.segment = local_a98._reader.segment;
    reader_03._reader.data = local_a98._reader.data;
    reader_03._reader.pointers = local_a98._reader.pointers;
    reader_03._reader.dataSize = local_a98._reader.dataSize;
    reader_03._reader.pointerCount = local_a98._reader.pointerCount;
    reader_03._reader._38_2_ = local_a98._reader._38_2_;
    reader_03._reader.nestingLimit = local_a98._reader.nestingLimit;
    reader_03._reader._44_4_ = local_a98._reader._44_4_;
    writeConversion(this,reader_03,output);
    message_1.super_InputStreamMessageReader._292_4_ = 1;
    TextCodec::~TextCodec((TextCodec *)&root.builder.field_0x27);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_9e0);
    kj::String::~String((String *)&message_4.moreSegments.builder.disposer);
    break;
  case JSON:
    readOneJson((String *)&message_5.moreSegments.builder.disposer,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&codec_1.impl.ptr,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec((JsonCodec *)local_be8);
    JsonCodec::setPrettyPrint((JsonCodec *)local_be8,(bool)(this->pretty & 1));
    root_1.builder._32_8_ = (this->rootType).super_Schema.raw;
    JsonCodec::handleByAnnotation((JsonCodec *)local_be8,(Schema)root_1.builder._32_8_);
    local_c28.raw = (this->rootType).super_Schema.raw;
    MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
              ((Builder *)auStack_c20,(MessageBuilder *)&codec_1.impl.ptr,
               (StructSchema)local_c28.raw);
    local_c38 = kj::String::operator_cast_to_ArrayPtr
                          ((String *)&message_5.moreSegments.builder.disposer);
    local_c48 = root_1.builder.data;
    pWStack_c40 = root_1.builder.pointers;
    local_c58 = root_1.builder.segment;
    pCStack_c50 = root_1.builder.capTable;
    local_c68 = (RawBrandedSchema *)auStack_c20;
    SStack_c60 = root_1.schema.super_Schema.raw;
    output_01.builder.segment = (SegmentBuilder *)root_1.schema.super_Schema.raw;
    output_01.schema.super_Schema.raw = (Schema)(Schema)auStack_c20;
    output_01.builder.capTable = (CapTableBuilder *)root_1.builder.segment;
    output_01.builder.data = root_1.builder.capTable;
    output_01.builder.pointers = (WirePointer *)root_1.builder.data;
    output_01.builder._32_8_ = root_1.builder.pointers;
    JsonCodec::decode((JsonCodec *)local_be8,local_c38,output_01);
    DynamicStruct::Builder::asReader(&local_cd0,(Builder *)auStack_c20);
    DynamicStruct::Reader::operator_cast_to_Reader(&local_c98,&local_cd0);
    reader_04._reader.capTable = local_c98._reader.capTable;
    reader_04._reader.segment = local_c98._reader.segment;
    reader_04._reader.data = local_c98._reader.data;
    reader_04._reader.pointers = local_c98._reader.pointers;
    reader_04._reader.dataSize = local_c98._reader.dataSize;
    reader_04._reader.pointerCount = local_c98._reader.pointerCount;
    reader_04._reader._38_2_ = local_c98._reader._38_2_;
    reader_04._reader.nestingLimit = local_c98._reader.nestingLimit;
    reader_04._reader._44_4_ = local_c98._reader._44_4_;
    writeConversion(this,reader_04,output);
    message_1.super_InputStreamMessageReader._292_4_ = 1;
    JsonCodec::~JsonCodec((JsonCodec *)local_be8);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&codec_1.impl.ptr);
    kj::String::~String((String *)&message_5.moreSegments.builder.disposer);
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher((ParseErrorCatcher *)&message.unwindDetector);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(kj::arrayPtr(&dummy, 1).asBytes(), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }